

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O0

void __thiscall SynchronizedQueue<Buffer>::put(SynchronizedQueue<Buffer> *this,Buffer *value)

{
  size_type sVar1;
  __sighandler_t __handler;
  Buffer *value_local;
  SynchronizedQueue<Buffer> *this_local;
  
  Monitor::enter(&this->super_Monitor);
  std::queue<Buffer,_std::deque<Buffer,_std::allocator<Buffer>_>_>::push(&this->values,value);
  sVar1 = std::queue<Buffer,_std::deque<Buffer,_std::allocator<Buffer>_>_>::size(&this->values);
  if (sVar1 == 1) {
    Monitor::signal(&this->super_Monitor,(int)this + 0x70,__handler);
  }
  Monitor::leave(&this->super_Monitor);
  return;
}

Assistant:

void SynchronizedQueue<T>::put(T value) {
    enter();
    values.push(value);
    if (values.size() == 1) {
        signal(isEmpty);
    }
    leave();
}